

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_ConstAcc.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_ConstAcc::ArchiveIN(ChFunction_ConstAcc *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_ConstAcc>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->h;
  local_30._name = "h";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->end;
  local_48._name = "end";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->aw;
  local_60._name = "aw";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->av;
  local_78._name = "av";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChFunction_ConstAcc::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_ConstAcc>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(h);
    marchive >> CHNVP(end);
    marchive >> CHNVP(aw);
    marchive >> CHNVP(av);
}